

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.cpp
# Opt level: O1

string * pbrt::internal::ToString3<float>(float x,float y,float z)

{
  string *in_RDI;
  float local_24;
  float local_20;
  float local_1c;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<float&,float&,float&>
            (in_RDI,"[ %f, %f, %f ]",&local_1c,&local_20,&local_24);
  return in_RDI;
}

Assistant:

std::string internal::ToString3(T x, T y, T z) {
    if (std::is_floating_point<T>::value)
        return StringPrintf("[ %f, %f, %f ]", x, y, z);
    else
        return StringPrintf("[ %d, %d, %d ]", x, y, z);
}